

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  byte bVar1;
  short sVar2;
  unsigned_short localRegisterID;
  ProfileId profileId;
  ProfileId arrayProfileId;
  Type ppvVar3;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  long lVar4;
  uint uVar5;
  Var pvVar6;
  void **__s;
  Arguments *args;
  uint uVar7;
  Type TVar8;
  void *apvStack_e0 [2];
  Var stackArgs [8];
  Arguments local_90;
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  Arguments local_50;
  Type local_40;
  Type local_38;
  
  __s = apvStack_e0 + 1;
  if (((byte)this[0xd6] & 0x10) == 0) {
    OP_NewScObjArray_Impl<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false>
              (this,playout,spreadIndices);
    return;
  }
  TVar8 = (Type)((ulong)(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                        ArgCount | 0x1000000);
  ppvVar3 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    sVar2 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Return;
    apvStack_e0[0] = (void *)0x981dd9;
    pvVar6 = GetReg<unsigned_short>
                       (this,(playout->
                             super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                             Function);
    args = &local_60;
    local_60.Info = TVar8;
    local_60.Values = ppvVar3;
  }
  else {
    apvStack_e0[0] = (void *)0x981d6c;
    local_90.Info = TVar8;
    local_90.Values = ppvVar3;
    local_40 = TVar8;
    local_38 = ppvVar3;
    uVar5 = JavascriptFunction::GetSpreadSize
                      (&local_90,spreadIndices,*(ScriptContext **)(this + 0x78));
    uVar7 = (uVar5 & 0xffffff) + 0x1000000;
    local_50.Info._4_4_ = 0;
    local_50.Info._0_4_ = uVar7;
    if ((uVar5 & 0xffffff) < 9) {
      __s = apvStack_e0 + 1;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      apvStack_e0[1] = (void *)0x0;
      stackArgs[0] = (Var)0x0;
    }
    else {
      uVar7 = uVar7 * 8 & 0x7fffff8;
      apvStack_e0[0] = (void *)0x981da6;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,(ulong)uVar7 + 0xc00,
                 *(ScriptContext **)(this + 0x78),(PVOID)0x0);
      lVar4 = -(ulong)(uVar7 + 0xf & 0xfffffff0);
      __s = (void **)((long)stackArgs + lVar4 + -8);
      *(undefined8 *)((long)apvStack_e0 + lVar4) = 0x981dc5;
      memset(__s,0,(ulong)uVar7);
    }
    local_80.Info = local_40;
    local_80.Values = local_38;
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_50.Values = __s;
    __s[-1] = (void *)0x981e2f;
    JavascriptFunction::SpreadArgs(&local_80,&local_50,spreadIndices,scriptContext);
    sVar2 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Return;
    localRegisterID =
         (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Function;
    __s[-1] = (void *)0x981e41;
    pvVar6 = GetReg<unsigned_short>(this,localRegisterID);
    args = &local_70;
    local_70.Info = local_50.Info;
    local_70.Values = local_50.Values;
  }
  caller = *(ScriptFunction **)(this + 0x80);
  profileId = *(ProfileId *)
               &playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>;
  arrayProfileId =
       *(ProfileId *)
        ((long)&playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return +
        1);
  __s[-1] = (void *)0x981e66;
  pvVar6 = ProfilingHelpers::ProfiledNewScObjArray(pvVar6,args,caller,profileId,arrayProfileId);
  __s[-1] = (void *)0x981e74;
  SetReg<unsigned_int>(this,(int)sVar2,pvVar6);
  bVar1 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).ArgCount;
  __s[-1] = (void *)0x981e80;
  PopOut(this,(ushort)bVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }